

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddLoad
          (InstructionBuilder *this,uint32_t type_id,uint32_t base_ptr_id,uint32_t alignment)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  uint32_t res_id;
  Instruction *pIVar1;
  IRContext *c;
  IRContext *this_00;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_190
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  SmallVector<unsigned_int,_2UL> local_170;
  Operand local_148;
  uint local_114;
  iterator local_110;
  undefined8 local_108;
  SmallVector<unsigned_int,_2UL> local_100;
  Operand local_d8;
  uint32_t local_a4;
  iterator local_a0;
  undefined8 local_98;
  SmallVector<unsigned_int,_2UL> local_90;
  Operand local_68;
  undefined1 local_38 [8];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  uint32_t alignment_local;
  uint32_t base_ptr_id_local;
  uint32_t type_id_local;
  InstructionBuilder *this_local;
  
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = alignment;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_38);
  local_a0 = &local_a4;
  local_98 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_a0;
  local_a4 = base_ptr_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list_01);
  Operand::Operand(&local_68,SPV_OPERAND_TYPE_ID,&local_90);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_38,
             &local_68);
  Operand::~Operand(&local_68);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
  if (operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
    local_114 = 2;
    local_110 = &local_114;
    local_108 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_110;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list_00);
    Operand::Operand(&local_d8,SPV_OPERAND_TYPE_MEMORY_ACCESS,&local_100);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_38,
               &local_d8);
    Operand::~Operand(&local_d8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_100);
    new_inst._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
         operands.
         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage._4_4_;
    init_list._M_len = 1;
    init_list._M_array =
         (iterator)
         ((long)&new_inst._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 4);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_170,init_list);
    Operand::Operand(&local_148,SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,&local_170);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_38,
               &local_148);
    Operand::~Operand(&local_148);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_170);
  }
  pIVar1 = (Instruction *)::operator_new(0x70);
  c = GetContext(this);
  this_00 = GetContext(this);
  res_id = IRContext::TakeNextId(this_00);
  opt::Instruction::Instruction(pIVar1,c,OpLoad,type_id,res_id,(OperandList *)local_38);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_190,pIVar1);
  pIVar1 = AddInstruction(this,&local_190);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_190);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_38);
  return pIVar1;
}

Assistant:

Instruction* AddLoad(uint32_t type_id, uint32_t base_ptr_id,
                       uint32_t alignment = 0) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {base_ptr_id}});
    if (alignment != 0) {
      operands.push_back(
          {SPV_OPERAND_TYPE_MEMORY_ACCESS,
           {static_cast<uint32_t>(spv::MemoryAccessMask::Aligned)}});
      operands.push_back({SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER, {alignment}});
    }

    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> new_inst(
        new Instruction(GetContext(), spv::Op::OpLoad, type_id,
                        GetContext()->TakeNextId(), operands));
    return AddInstruction(std::move(new_inst));
  }